

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionModelBullet::SyncPosition(ChCollisionModelBullet *this)

{
  cbtCollisionObject *pcVar1;
  ChCoordsys<double> mcsys;
  double local_98;
  double local_90;
  double local_88;
  ChQuaternion<double> local_80;
  ChMatrix33<double> local_60;
  
  (*((this->super_ChCollisionModel).mcontactable)->_vptr_ChContactable[0xb])(&local_98);
  pcVar1 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  (pcVar1->m_worldTransform).m_origin.m_floats[0] = (float)local_98;
  (pcVar1->m_worldTransform).m_origin.m_floats[1] = (float)local_90;
  (pcVar1->m_worldTransform).m_origin.m_floats[2] = (float)local_88;
  (pcVar1->m_worldTransform).m_origin.m_floats[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_60,&local_80);
  pcVar1 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  (pcVar1->m_worldTransform).m_basis.m_el[0].m_floats[0] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[0].m_floats[1] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[0].m_floats[2] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
  (pcVar1->m_worldTransform).m_basis.m_el[1].m_floats[0] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[1].m_floats[1] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[1].m_floats[2] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
  (pcVar1->m_worldTransform).m_basis.m_el[2].m_floats[0] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[2].m_floats[1] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[2].m_floats[2] =
       (float)local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  (pcVar1->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
  return;
}

Assistant:

void ChCollisionModelBullet::SyncPosition() {
    ChCoordsys<> mcsys = mcontactable->GetCsysForCollisionModel();

    bt_collision_object->getWorldTransform().setOrigin(
        cbtVector3((cbtScalar)mcsys.pos.x(), (cbtScalar)mcsys.pos.y(), (cbtScalar)mcsys.pos.z()));
    const ChMatrix33<>& rA(mcsys.rot);
    cbtMatrix3x3 basisA((cbtScalar)rA(0, 0), (cbtScalar)rA(0, 1), (cbtScalar)rA(0, 2), (cbtScalar)rA(1, 0),
                        (cbtScalar)rA(1, 1), (cbtScalar)rA(1, 2), (cbtScalar)rA(2, 0), (cbtScalar)rA(2, 1),
                        (cbtScalar)rA(2, 2));
    bt_collision_object->getWorldTransform().setBasis(basisA);
}